

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidget::setMaximumHeight(QWidget *this,int h)

{
  ushort uVar1;
  QWidgetPrivate *this_00;
  long lVar2;
  QWExtra *pQVar3;
  int maxw;
  
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  QWidgetPrivate::createExtra(this_00);
  uVar1 = *(ushort *)
           &((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
             _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
  lVar2 = *(long *)(*(long *)&this->field_0x8 + 0x78);
  if (lVar2 == 0) {
    maxw = 0xffffff;
  }
  else {
    maxw = *(int *)(lVar2 + 0x68);
  }
  setMaximumSize(this,maxw,h);
  pQVar3 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  *(ushort *)&pQVar3->field_0x7c =
       (ushort)*(undefined4 *)&pQVar3->field_0x7c & 0xfff3 |
       uVar1 & 0xc | (ushort)(h != 0xffffff) << 3;
  return;
}

Assistant:

void QWidget::setMaximumHeight(int h)
{
    Q_D(QWidget);
    d->createExtra();
    uint expl = d->extra->explicitMaxSize | (h == QWIDGETSIZE_MAX ? 0 : Qt::Vertical);
    setMaximumSize(maximumSize().width(), h);
    d->extra->explicitMaxSize = expl;
}